

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O1

void rtcSetGeometryTimeRange(RTCGeometry hgeometry,float startTime,float endTime)

{
  BBox1f range;
  undefined8 *puVar1;
  DeviceEnterLeave enterleave;
  DeviceEnterLeave local_80;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  float local_58;
  float local_48;
  
  local_58 = endTime;
  local_48 = startTime;
  if (hgeometry == (RTCGeometry)0x0) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"invalid argument","");
    *puVar1 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar1 + 1) = 2;
    puVar1[2] = puVar1 + 4;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_78,local_78 + local_70);
    __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
  }
  (**(code **)(*(long *)hgeometry + 0x10))(hgeometry);
  embree::DeviceEnterLeave::DeviceEnterLeave(&local_80,hgeometry);
  if (local_48 <= local_58) {
    range.upper = local_58;
    range.lower = local_48;
    embree::Geometry::setTimeRange((Geometry *)hgeometry,range);
    embree::DeviceEnterLeave::~DeviceEnterLeave(&local_80);
    if (hgeometry != (RTCGeometry)0x0) {
      (**(code **)(*(long *)hgeometry + 0x18))(hgeometry);
    }
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"startTime has to be smaller or equal to the endTime","");
  *puVar1 = &PTR__rtcore_error_022018b0;
  *(undefined4 *)(puVar1 + 1) = 2;
  puVar1[2] = puVar1 + 4;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_78,local_78 + local_70);
  __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API void rtcSetGeometryTimeRange(RTCGeometry hgeometry, float startTime, float endTime)
  {
    Ref<Geometry> geometry = (Geometry*) hgeometry;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcSetGeometryTimeRange);
    RTC_VERIFY_HANDLE(hgeometry);
    RTC_ENTER_DEVICE(hgeometry);

    if (startTime > endTime)
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"startTime has to be smaller or equal to the endTime");
        
    geometry->setTimeRange(BBox1f(startTime,endTime));
    RTC_CATCH_END2(geometry);
  }